

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

void __thiscall ghc::filesystem::directory_entry::refresh(directory_entry *this)

{
  file_type code;
  filesystem_error *this_00;
  error_code ec_00;
  error_code ec;
  string local_50;
  file_status local_30;
  error_category *local_28;
  
  local_30._type = none;
  local_28 = (error_category *)std::_V2::system_category();
  detail::status_ex((path *)&local_50,(error_code *)this,&local_30,
                    (uintmax_t *)&this->_symlink_status,&this->_file_size,
                    (time_t *)&this->_hard_link_count,(int)this + 0x40);
  code = local_30._type;
  (this->_status)._type = (file_type)local_50._M_dataplus._M_p;
  (this->_status)._perms = local_50._M_dataplus._M_p._4_2_;
  if (local_30._type == none) {
    return;
  }
  this_00 = (filesystem_error *)__cxa_allocate_exception(0x90);
  detail::systemErrorText<int>(&local_50,code);
  ec_00._4_4_ = 0;
  ec_00._M_value = code;
  ec_00._M_cat = local_28;
  filesystem_error::filesystem_error(this_00,&local_50,&this->_path,ec_00);
  __cxa_throw(this_00,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE void directory_entry::refresh()
{
    std::error_code ec;
    refresh(ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), _path, ec);
    }
}